

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O2

cio_bs_state internal_read_at_least(cio_buffered_stream *buffered_stream)

{
  cio_read_buffer *read_buffer;
  cio_bs_state cVar1;
  
  read_buffer = buffered_stream->read_buffer;
  if (buffered_stream->last_error != CIO_SUCCESS) {
    cVar1 = call_handler(buffered_stream,buffered_stream->last_error,read_buffer,0);
    return cVar1;
  }
  if ((ulong)((long)read_buffer->add_ptr - (long)read_buffer->fetch_ptr) <
      (buffered_stream->read_info).bytes_to_read) {
    return CIO_BS_AGAIN;
  }
  cVar1 = call_handler(buffered_stream,CIO_SUCCESS,read_buffer,
                       (buffered_stream->read_info).bytes_to_read);
  return cVar1;
}

Assistant:

static enum cio_bs_state internal_read_at_least(struct cio_buffered_stream *buffered_stream)
{
	struct cio_read_buffer *read_buffer = buffered_stream->read_buffer;

	if (cio_unlikely(buffered_stream->last_error != CIO_SUCCESS)) {
		return call_handler(buffered_stream, buffered_stream->last_error, read_buffer, 0);
	}

	size_t available = cio_read_buffer_unread_bytes(read_buffer);
	if (buffered_stream->read_info.bytes_to_read <= available) {
		return call_handler(buffered_stream, CIO_SUCCESS, read_buffer, buffered_stream->read_info.bytes_to_read);
	}

	return CIO_BS_AGAIN;
}